

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_ftssel_s_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = 0;
  do {
    uVar2 = 0x3f800000;
    if ((*(uint *)((long)vm + lVar1) & 1) == 0) {
      uVar2 = *(uint *)((long)vn + lVar1);
    }
    *(uint *)((long)vd + lVar1) = (*(uint *)((long)vm + lVar1) & 0xfffffffe) << 0x1e ^ uVar2;
    lVar1 = lVar1 + 4;
  } while ((ulong)(desc & 0x1f) * 8 + 8 != lVar1);
  return;
}

Assistant:

void HELPER(sve_ftssel_s)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 4;
    uint32_t *d = vd, *n = vn, *m = vm;
    for (i = 0; i < opr_sz; i += 1) {
        uint32_t nn = n[i];
        uint32_t mm = m[i];
        if (mm & 1) {
            nn = float32_one;
        }
        d[i] = nn ^ (mm & 2) << 30;
    }
}